

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::insert_heap
          (clusterizer<crnlib::vec<2U,_float>_> *this,uint node_index)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  float i;
  vq_node *pvVar4;
  uint *puVar5;
  float parent_variance;
  uint parent;
  uint pos;
  float variance;
  uint node_index_local;
  clusterizer<crnlib::vec<2U,_float>_> *this_local;
  
  pvVar4 = vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::operator[]
                     (&this->m_nodes,node_index);
  fVar1 = pvVar4->m_variance;
  parent_variance = (float)(this->m_heap_size + 1);
  this->m_heap_size = (uint)parent_variance;
  uVar2 = this->m_heap_size;
  uVar3 = vector<unsigned_int>::size(&this->m_heap);
  if (uVar3 <= uVar2) {
    vector<unsigned_int>::resize(&this->m_heap,this->m_heap_size + 1,false);
  }
  while (i = (float)((uint)parent_variance >> 1), i != 0.0) {
    puVar5 = vector<unsigned_int>::operator[](&this->m_heap,(uint)i);
    pvVar4 = vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::operator[]
                       (&this->m_nodes,*puVar5);
    if (fVar1 < pvVar4->m_variance) break;
    puVar5 = vector<unsigned_int>::operator[](&this->m_heap,(uint)i);
    uVar2 = *puVar5;
    puVar5 = vector<unsigned_int>::operator[](&this->m_heap,(uint)parent_variance);
    *puVar5 = uVar2;
    parent_variance = i;
  }
  puVar5 = vector<unsigned_int>::operator[](&this->m_heap,(uint)parent_variance);
  *puVar5 = node_index;
  return;
}

Assistant:

void insert_heap(uint node_index)
        {
            const float variance = m_nodes[node_index].m_variance;
            uint pos = ++m_heap_size;

            if (m_heap_size >= m_heap.size())
            {
                m_heap.resize(m_heap_size + 1);
            }

            for (;;)
            {
                uint parent = pos >> 1;
                if (!parent)
                {
                    break;
                }

                float parent_variance = m_nodes[m_heap[parent]].m_variance;
                if (parent_variance > variance)
                {
                    break;
                }

                m_heap[pos] = m_heap[parent];

                pos = parent;
            }

            m_heap[pos] = node_index;
        }